

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O3

Debug * Corrade::Utility::operator<<(Debug *debug,Color value)

{
  Debug *pDVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  char *local_18;
  
  uVar2 = CONCAT71(in_register_00000031,value) & 0xffffffff;
  switch(uVar2) {
  case 0:
    local_18 = "Utility::Debug::Color::Black";
    break;
  case 1:
    local_18 = "Utility::Debug::Color::Red";
    break;
  case 2:
    local_18 = "Utility::Debug::Color::Green";
    break;
  case 3:
    local_18 = "Utility::Debug::Color::Yellow";
    break;
  case 4:
    local_18 = "Utility::Debug::Color::Blue";
    break;
  case 5:
    local_18 = "Utility::Debug::Color::Magenta";
    break;
  case 6:
    local_18 = "Utility::Debug::Color::Cyan";
    break;
  case 7:
    local_18 = "Utility::Debug::Color::White";
    break;
  default:
    local_18 = "Utility::Debug::Color(";
    pDVar1 = Debug::print<char_const*>(debug,&local_18);
    (pDVar1->_immediateFlags)._value = (pDVar1->_immediateFlags)._value | 0x84;
    debug = Debug::operator<<(pDVar1,(uchar)uVar2);
    (debug->_immediateFlags)._value = (debug->_immediateFlags)._value | 4;
    local_18 = ")";
    break;
  case 9:
    local_18 = "Utility::Debug::Color::Default";
  }
  pDVar1 = Debug::print<char_const*>(debug,&local_18);
  return pDVar1;
}

Assistant:

Debug& operator<<(Debug& debug, Debug::Color value) {
    switch(value) {
        /* LCOV_EXCL_START */
        #define _c(value) case Debug::Color::value: return debug << "Utility::Debug::Color::" #value;
        _c(Black)
        _c(Red)
        _c(Green)
        _c(Yellow)
        _c(Blue)
        _c(Magenta)
        _c(Cyan)
        _c(White)
        #if !defined(CORRADE_TARGET_WINDOWS) || defined(CORRADE_UTILITY_USE_ANSI_COLORS)
        _c(Default) /* Alias to White on Windows */
        #endif
        #undef _c
        /* LCOV_EXCL_STOP */
    }

    return debug << "Utility::Debug::Color(" << Debug::nospace << Debug::hex << static_cast<unsigned char>(char(value)) << Debug::nospace << ")";
}